

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<float> metaf::Speed::knotsToUnit(float valueKnots,Unit otherUnit)

{
  optional<float> *this;
  uint in_EDI;
  double *in_stack_ffffffffffffffc8;
  _Optional_base<float,_true,_true> local_8;
  
  this = (optional<float> *)(ulong)in_EDI;
  switch(this) {
  case (optional<float> *)0x0:
    std::optional<float>::optional<float,_true>(this,(float *)in_stack_ffffffffffffffc8);
    break;
  case (optional<float> *)0x1:
    std::optional<float>::optional<double,_true>(this,in_stack_ffffffffffffffc8);
    break;
  case (optional<float> *)0x2:
    std::optional<float>::optional<double,_true>(this,in_stack_ffffffffffffffc8);
    break;
  case (optional<float> *)0x3:
    std::optional<float>::optional<double,_true>(this,in_stack_ffffffffffffffc8);
    break;
  default:
    std::optional<float>::optional((optional<float> *)0x26b61b);
  }
  return (_Optional_base<float,_true,_true>)
         (_Optional_base<float,_true,_true>)local_8._M_payload.super__Optional_payload_base<float>;
}

Assistant:

std::optional<float> Speed::knotsToUnit(float valueKnots, Unit otherUnit) {
	switch(otherUnit) {
		case Unit::KNOTS: 				return valueKnots;
		case Unit::METERS_PER_SECOND: 	return (valueKnots * 0.514444);
		case Unit::KILOMETERS_PER_HOUR:	return (valueKnots * 1.852);
		case Unit::MILES_PER_HOUR:		return (valueKnots * 1.150779);
		default:						return std::optional<float>();
	}
}